

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

Program __thiscall soul::heart::Parser::parse(Parser *this)

{
  Program *this_00;
  ProgramImpl *pPVar1;
  ScannedTopLevelItem *item_00;
  ScannedTopLevelItem *pSVar2;
  ScannedTopLevelItem *pSVar3;
  ScannedTopLevelItem *item_01;
  pointer pSVar4;
  pointer pSVar5;
  ProgramImpl *pPVar6;
  bool bVar7;
  int iVar8;
  Module *newModule;
  RefCountedPtr<soul::Program::ProgramImpl> extraout_RDX;
  ScannedTopLevelItem *item;
  pointer item_02;
  ScannedTopLevelItem *item_03;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  *__range2;
  Parser *in_RSI;
  char *__s1;
  Program PVar9;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  scannedTopLevelItems;
  CodeLocation moduleLocation;
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  local_98;
  CodeLocation local_80;
  ProgramImpl *local_70;
  CompileMessage local_68;
  
  local_70 = (ProgramImpl *)this;
  checkVersionDeclaration(in_RSI);
  local_98.
  super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (ScannedTopLevelItem *)0x0;
  local_98.
  super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (ScannedTopLevelItem *)0x0;
  local_98.
  super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::reserve(&local_98,0x80);
  __s1 = (in_RSI->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).currentType.text;
  if (__s1 != "$eof") {
    this_00 = &in_RSI->program;
    do {
      if ((__s1 != (char *)0x0) && (iVar8 = strcmp(__s1,"$eof"), iVar8 == 0)) break;
      local_80.sourceCode.object =
           (in_RSI->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.sourceCode.object;
      if (local_80.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_80.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_80.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_80.location.data =
           (in_RSI->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&in_RSI->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,"graph");
      if (bVar7) {
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::skip(&in_RSI->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              );
        newModule = Program::addGraph(this_00,-1);
LAB_00226289:
        scanTopLevelItem(in_RSI,&local_80,&local_98,newModule);
      }
      else {
        bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matches(&in_RSI->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,"processor");
        if (bVar7) {
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&in_RSI->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
          newModule = Program::addProcessor(this_00,-1);
          goto LAB_00226289;
        }
        bVar7 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matches(&in_RSI->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,"namespace");
        if (bVar7) {
          Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::skip(&in_RSI->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                );
          newModule = Program::addNamespace(this_00,-1);
          goto LAB_00226289;
        }
        CompileMessageHelpers::createMessage<>
                  (&local_68,syntax,error,"Expected a graph, processor or namespace declaration");
        (*(in_RSI->
          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          )._vptr_Tokeniser[2])();
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
          operator_delete(local_68.description._M_dataplus._M_p,
                          local_68.description.field_2._M_allocated_capacity + 1);
        }
      }
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_80.sourceCode.object);
      __s1 = (in_RSI->
             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ).currentType.text;
    } while (__s1 != "$eof");
  }
  pPVar6 = local_70;
  pSVar4 = local_98.
           super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  item_02 = local_98.
            super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_98.
      super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      parseModuleStructs(in_RSI,item_02);
      pSVar5 = local_98.
               super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      item_02 = item_02 + 1;
      item_00 = local_98.
                super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar2 = local_98.
               super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (item_02 != pSVar4);
    for (; item_03 = local_98.
                     super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                     ._M_impl.super__Vector_impl_data._M_start, pSVar3 = pSVar2,
        item_01 = local_98.
                  super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                  ._M_impl.super__Vector_impl_data._M_start, item_00 != pSVar5;
        item_00 = item_00 + 1) {
      local_98.
      super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar2;
      parseFunctionDecls(in_RSI,item_00);
      pSVar2 = local_98.
               super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; local_98.
           super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
           ._M_impl.super__Vector_impl_data._M_start = item_03,
        local_98.
        super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
        ._M_impl.super__Vector_impl_data._M_finish = pSVar3, item_01 != pSVar2;
        item_01 = item_01 + 1) {
      parseStateVariables(in_RSI,item_01);
      item_03 = local_98.
                super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pSVar3 = local_98.
               super__Vector_base<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; item_03 != pSVar3; item_03 = item_03 + 1) {
      parseModule(in_RSI,item_03);
    }
  }
  *(ProgramImpl **)pPVar6 = (in_RSI->program).pimpl;
  pPVar1 = (in_RSI->program).refHolder.object;
  (pPVar6->allocator).pool.pools.
  super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pPVar1;
  if (pPVar1 != (ProgramImpl *)0x0) {
    (pPVar1->super_RefCountedObject).refCount = (pPVar1->super_RefCountedObject).refCount + 1;
  }
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::~vector(&local_98);
  PVar9.refHolder.object = extraout_RDX.object;
  PVar9.pimpl = pPVar6;
  return PVar9;
}

Assistant:

Program parse()
    {
        checkVersionDeclaration();

        std::vector<ScannedTopLevelItem> scannedTopLevelItems;
        scannedTopLevelItems.reserve (128);

        while (! matches (Token::eof))
        {
            auto moduleLocation = location;

            if (matchIf ("graph"))              scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addGraph());
            else if (matchIf ("processor"))     scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addProcessor());
            else if (matchIf ("namespace"))     scanTopLevelItem (moduleLocation, scannedTopLevelItems, program.addNamespace());
            else                                throwError (Errors::expectedTopLevelDecl());
        }

        for (auto& item : scannedTopLevelItems)  parseModuleStructs (item);
        for (auto& item : scannedTopLevelItems)  parseFunctionDecls (item);
        for (auto& item : scannedTopLevelItems)  parseStateVariables (item);
        for (auto& item : scannedTopLevelItems)  parseModule (item);

        return program;
    }